

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

void enet_protocol_notify_disconnect(ENetHost *host,ENetPeer *peer,ENetEvent *event)

{
  undefined4 *in_RDX;
  ENetHost *in_RSI;
  long in_RDI;
  
  if (2 < (uint)in_RSI->channelLimit) {
    *(undefined4 *)(in_RDI + 0x20) = 1;
  }
  if (((int)in_RSI->channelLimit == 1) || (3 < (uint)in_RSI->channelLimit)) {
    if (in_RDX == (undefined4 *)0x0) {
      *(undefined4 *)((long)in_RSI->commands + 0x15c) = 0;
      enet_protocol_dispatch_state(in_RSI,(ENetPeer *)0x0,ENET_PEER_STATE_DISCONNECTED);
    }
    else {
      *in_RDX = 2;
      *(ENetHost **)(in_RDX + 2) = in_RSI;
      in_RDX[5] = 0;
      enet_peer_reset((ENetPeer *)0x10a47e);
    }
  }
  else {
    enet_peer_reset((ENetPeer *)0x10a449);
  }
  return;
}

Assistant:

static void
enet_protocol_notify_disconnect (ENetHost * host, ENetPeer * peer, ENetEvent * event)
{
    if (peer -> state >= ENET_PEER_STATE_CONNECTION_PENDING)
       host -> recalculateBandwidthLimits = 1;

    if (peer -> state != ENET_PEER_STATE_CONNECTING && peer -> state < ENET_PEER_STATE_CONNECTION_SUCCEEDED)
        enet_peer_reset (peer);
    else
    if (event != NULL)
    {
        event -> type = ENET_EVENT_TYPE_DISCONNECT;
        event -> peer = peer;
        event -> data = 0;

        enet_peer_reset (peer);
    }
    else 
    {
        peer -> eventData = 0;

        enet_protocol_dispatch_state (host, peer, ENET_PEER_STATE_ZOMBIE);
    }
}